

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost89.c
# Opt level: O0

void gostcrypt(gost_ctx *c,byte *in,byte *out)

{
  word32 wVar1;
  word32 wVar2;
  uint uVar3;
  uint uVar4;
  undefined1 *in_RDX;
  uint *in_RSI;
  gost_ctx *in_RDI;
  word32 n2;
  word32 n1;
  
  uVar3 = *in_RSI;
  uVar4 = in_RSI[1];
  wVar1 = f(in_RDI,uVar3 + in_RDI->key[0] + in_RDI->mask[0]);
  wVar2 = f(in_RDI,(wVar1 ^ uVar4) + in_RDI->key[1] + in_RDI->mask[1]);
  uVar3 = wVar2 ^ uVar3;
  wVar2 = f(in_RDI,uVar3 + in_RDI->key[2] + in_RDI->mask[2]);
  uVar4 = wVar2 ^ wVar1 ^ uVar4;
  wVar1 = f(in_RDI,uVar4 + in_RDI->key[3] + in_RDI->mask[3]);
  uVar3 = wVar1 ^ uVar3;
  wVar1 = f(in_RDI,uVar3 + in_RDI->key[4] + in_RDI->mask[4]);
  uVar4 = wVar1 ^ uVar4;
  wVar1 = f(in_RDI,uVar4 + in_RDI->key[5] + in_RDI->mask[5]);
  uVar3 = wVar1 ^ uVar3;
  wVar1 = f(in_RDI,uVar3 + in_RDI->key[6] + in_RDI->mask[6]);
  uVar4 = wVar1 ^ uVar4;
  wVar1 = f(in_RDI,uVar4 + in_RDI->key[7] + in_RDI->mask[7]);
  uVar3 = wVar1 ^ uVar3;
  wVar1 = f(in_RDI,uVar3 + in_RDI->key[0] + in_RDI->mask[0]);
  uVar4 = wVar1 ^ uVar4;
  wVar1 = f(in_RDI,uVar4 + in_RDI->key[1] + in_RDI->mask[1]);
  uVar3 = wVar1 ^ uVar3;
  wVar1 = f(in_RDI,uVar3 + in_RDI->key[2] + in_RDI->mask[2]);
  uVar4 = wVar1 ^ uVar4;
  wVar1 = f(in_RDI,uVar4 + in_RDI->key[3] + in_RDI->mask[3]);
  uVar3 = wVar1 ^ uVar3;
  wVar1 = f(in_RDI,uVar3 + in_RDI->key[4] + in_RDI->mask[4]);
  uVar4 = wVar1 ^ uVar4;
  wVar1 = f(in_RDI,uVar4 + in_RDI->key[5] + in_RDI->mask[5]);
  uVar3 = wVar1 ^ uVar3;
  wVar1 = f(in_RDI,uVar3 + in_RDI->key[6] + in_RDI->mask[6]);
  uVar4 = wVar1 ^ uVar4;
  wVar1 = f(in_RDI,uVar4 + in_RDI->key[7] + in_RDI->mask[7]);
  uVar3 = wVar1 ^ uVar3;
  wVar1 = f(in_RDI,uVar3 + in_RDI->key[0] + in_RDI->mask[0]);
  uVar4 = wVar1 ^ uVar4;
  wVar1 = f(in_RDI,uVar4 + in_RDI->key[1] + in_RDI->mask[1]);
  uVar3 = wVar1 ^ uVar3;
  wVar1 = f(in_RDI,uVar3 + in_RDI->key[2] + in_RDI->mask[2]);
  uVar4 = wVar1 ^ uVar4;
  wVar1 = f(in_RDI,uVar4 + in_RDI->key[3] + in_RDI->mask[3]);
  uVar3 = wVar1 ^ uVar3;
  wVar1 = f(in_RDI,uVar3 + in_RDI->key[4] + in_RDI->mask[4]);
  uVar4 = wVar1 ^ uVar4;
  wVar1 = f(in_RDI,uVar4 + in_RDI->key[5] + in_RDI->mask[5]);
  uVar3 = wVar1 ^ uVar3;
  wVar1 = f(in_RDI,uVar3 + in_RDI->key[6] + in_RDI->mask[6]);
  uVar4 = wVar1 ^ uVar4;
  wVar1 = f(in_RDI,uVar4 + in_RDI->key[7] + in_RDI->mask[7]);
  uVar3 = wVar1 ^ uVar3;
  wVar1 = f(in_RDI,uVar3 + in_RDI->key[7] + in_RDI->mask[7]);
  uVar4 = wVar1 ^ uVar4;
  wVar1 = f(in_RDI,uVar4 + in_RDI->key[6] + in_RDI->mask[6]);
  uVar3 = wVar1 ^ uVar3;
  wVar1 = f(in_RDI,uVar3 + in_RDI->key[5] + in_RDI->mask[5]);
  uVar4 = wVar1 ^ uVar4;
  wVar1 = f(in_RDI,uVar4 + in_RDI->key[4] + in_RDI->mask[4]);
  uVar3 = wVar1 ^ uVar3;
  wVar1 = f(in_RDI,uVar3 + in_RDI->key[3] + in_RDI->mask[3]);
  uVar4 = wVar1 ^ uVar4;
  wVar1 = f(in_RDI,uVar4 + in_RDI->key[2] + in_RDI->mask[2]);
  uVar3 = wVar1 ^ uVar3;
  wVar1 = f(in_RDI,uVar3 + in_RDI->key[1] + in_RDI->mask[1]);
  uVar4 = wVar1 ^ uVar4;
  wVar1 = f(in_RDI,uVar4 + in_RDI->key[0] + in_RDI->mask[0]);
  uVar3 = wVar1 ^ uVar3;
  *in_RDX = (char)uVar4;
  in_RDX[1] = (char)(uVar4 >> 8);
  in_RDX[2] = (char)(uVar4 >> 0x10);
  in_RDX[3] = (char)(uVar4 >> 0x18);
  in_RDX[4] = (char)uVar3;
  in_RDX[5] = (char)(uVar3 >> 8);
  in_RDX[6] = (char)(uVar3 >> 0x10);
  in_RDX[7] = (char)(uVar3 >> 0x18);
  return;
}

Assistant:

void gostcrypt(gost_ctx * c, const byte * in, byte * out)
{
    register word32 n1, n2;     /* As named in the GOST */
    n1 = in[0] | (in[1] << 8) | (in[2] << 16) | ((word32) in[3] << 24);
    n2 = in[4] | (in[5] << 8) | (in[6] << 16) | ((word32) in[7] << 24);
    /* Instead of swapping halves, swap names each round */

    n2 ^= f(c, n1 + c->key[0] + c->mask[0]);
    n1 ^= f(c, n2 + c->key[1] + c->mask[1]);
    n2 ^= f(c, n1 + c->key[2] + c->mask[2]);
    n1 ^= f(c, n2 + c->key[3] + c->mask[3]);
    n2 ^= f(c, n1 + c->key[4] + c->mask[4]);
    n1 ^= f(c, n2 + c->key[5] + c->mask[5]);
    n2 ^= f(c, n1 + c->key[6] + c->mask[6]);
    n1 ^= f(c, n2 + c->key[7] + c->mask[7]);

    n2 ^= f(c, n1 + c->key[0] + c->mask[0]);
    n1 ^= f(c, n2 + c->key[1] + c->mask[1]);
    n2 ^= f(c, n1 + c->key[2] + c->mask[2]);
    n1 ^= f(c, n2 + c->key[3] + c->mask[3]);
    n2 ^= f(c, n1 + c->key[4] + c->mask[4]);
    n1 ^= f(c, n2 + c->key[5] + c->mask[5]);
    n2 ^= f(c, n1 + c->key[6] + c->mask[6]);
    n1 ^= f(c, n2 + c->key[7] + c->mask[7]);

    n2 ^= f(c, n1 + c->key[0] + c->mask[0]);
    n1 ^= f(c, n2 + c->key[1] + c->mask[1]);
    n2 ^= f(c, n1 + c->key[2] + c->mask[2]);
    n1 ^= f(c, n2 + c->key[3] + c->mask[3]);
    n2 ^= f(c, n1 + c->key[4] + c->mask[4]);
    n1 ^= f(c, n2 + c->key[5] + c->mask[5]);
    n2 ^= f(c, n1 + c->key[6] + c->mask[6]);
    n1 ^= f(c, n2 + c->key[7] + c->mask[7]);

    n2 ^= f(c, n1 + c->key[7] + c->mask[7]);
    n1 ^= f(c, n2 + c->key[6] + c->mask[6]);
    n2 ^= f(c, n1 + c->key[5] + c->mask[5]);
    n1 ^= f(c, n2 + c->key[4] + c->mask[4]);
    n2 ^= f(c, n1 + c->key[3] + c->mask[3]);
    n1 ^= f(c, n2 + c->key[2] + c->mask[2]);
    n2 ^= f(c, n1 + c->key[1] + c->mask[1]);
    n1 ^= f(c, n2 + c->key[0] + c->mask[0]);

    out[0] = (byte) (n2 & 0xff);
    out[1] = (byte) ((n2 >> 8) & 0xff);
    out[2] = (byte) ((n2 >> 16) & 0xff);
    out[3] = (byte) (n2 >> 24);
    out[4] = (byte) (n1 & 0xff);
    out[5] = (byte) ((n1 >> 8) & 0xff);
    out[6] = (byte) ((n1 >> 16) & 0xff);
    out[7] = (byte) (n1 >> 24);
}